

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O2

double __thiscall
HydBalance::findHeadErrorNorm
          (HydBalance *this,double lamda,double *dH,double *dQ,double *xQ,Network *nw)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  double *extraout_RDX;
  double *__to;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long *plVar5;
  
  this->maxFlowChangeLink = 0;
  this->maxHeadErr = 0.0;
  this->maxFlowChange = 0.0;
  uVar2 = Network::count(nw,LINK);
  uVar6 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar6;
  }
  dVar11 = 0.0;
  dVar9 = 0.0;
  __to = extraout_RDX;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    iVar3 = Network::link(nw,(char *)(uVar6 & 0xffffffff),(char *)__to);
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    iVar3 = *(int *)(plVar5[6] + 0x28);
    iVar1 = *(int *)(plVar5[7] + 0x28);
    dVar10 = dQ[uVar6];
    dVar7 = (double)plVar5[0xd] + dVar10 * lamda;
    xQ[iVar3] = xQ[iVar3] - dVar7;
    xQ[iVar1] = xQ[iVar1] + dVar7;
    dVar10 = ABS(dVar10 * lamda);
    if (this->maxFlowChange <= dVar10 && dVar10 != this->maxFlowChange) {
      this->maxFlowChange = dVar10;
      this->maxFlowChangeLink = (int)uVar6;
    }
    (**(code **)(*plVar5 + 0x90))(plVar5,nw);
    dVar10 = dH[iVar3] * lamda + *(double *)(plVar5[6] + 0x60);
    dVar7 = dH[iVar1] * lamda + *(double *)(plVar5[7] + 0x60);
    if (((double)plVar5[0x10] != 0.0) || (NAN((double)plVar5[0x10]))) {
      dVar8 = (double)plVar5[0xf];
    }
    else {
      dVar8 = dVar10 - dVar7;
      plVar5[0xf] = (long)dVar8;
    }
    dVar8 = (dVar10 - dVar7) - dVar8;
    dVar10 = ABS(dVar8);
    if (this->maxHeadErr <= dVar10 && dVar10 != this->maxHeadErr) {
      this->maxHeadErr = dVar10;
      this->maxHeadErrLink = (int)uVar6;
    }
    dVar9 = dVar9 + dVar8 * dVar8;
    dVar11 = dVar11 + 1.0;
    __to = dH;
  }
  return (double)(~-(ulong)(dVar11 == 0.0) & (ulong)(dVar9 / dVar11));
}

Assistant:

double HydBalance::findHeadErrorNorm(
        double lamda, double dH[], double dQ[], double xQ[], Network* nw)
{
    double norm = 0.0;
    double count = 0.0;
    maxHeadErr = 0.0;
    maxFlowChange = 0.0;
    maxFlowChangeLink = 0;

    int linkCount = nw->count(Element::LINK);
    for (int i = 0; i < linkCount; i++)
    {
        // ... identify link's end nodes

        Link* link = nw->link(i);
        int n1 = link->fromNode->index;
        int n2 = link->toNode->index;

        // ... apply updated flow to end node flow balances

        double flowChange = lamda * dQ[i];
        double flow = link->flow + flowChange;
        xQ[n1] -= flow;
        xQ[n2] += flow;

        // ... update network's max. flow change

        double err = abs(flowChange);
        if ( err > maxFlowChange )
        {
            maxFlowChange = err;
            maxFlowChangeLink = i;
        }

        // ... compute head loss and its gradient (head loss is saved
        // ... to link->hLoss and its gradient to link->hGrad)
//*******************************************************************
        link->findHeadLoss(nw, flow);
//*******************************************************************

        // ... evaluate head loss error

        double h1 = link->fromNode->head + lamda * dH[n1];
        double h2 = link->toNode->head + lamda * dH[n2];
        if ( link->hGrad == 0.0 ) link->hLoss = h1 - h2;
        err = h1 - h2 - link->hLoss;
        if ( abs(err) > maxHeadErr )
        {
            maxHeadErr = abs(err);
            maxHeadErrLink = i;
        }

        // ... update sum of squared errors

        norm += err * err;
        count += 1.0;
    }

    // ... return sum of squared errors normalized by link count

    if ( count == 0.0 ) return 0;
    else return norm / count;

}